

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::ParseHelper_Node_Enter(AMFImporter *this,CAMFImporter_NodeElement *pNode)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  _List_node_base *p_Var3;
  
  pCVar2 = this->mNodeElement_Cur;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(pCVar2->Child).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  this->mNodeElement_Cur = pNode;
  return;
}

Assistant:

void AMFImporter::ParseHelper_Node_Enter(CAMFImporter_NodeElement* pNode)
{
	mNodeElement_Cur->Child.push_back(pNode);// add new element to current element child list.
	mNodeElement_Cur = pNode;// switch current element to new one.
}